

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unifiedcache.cpp
# Opt level: O2

UnifiedCache * icu_63::UnifiedCache::getInstance(UErrorCode *status)

{
  UnifiedCache *pUVar1;
  
  umtx_initOnce(&gCacheInitOnce,cacheInit,status);
  pUVar1 = gCache;
  if (U_ZERO_ERROR < *status) {
    pUVar1 = (UnifiedCache *)0x0;
  }
  return pUVar1;
}

Assistant:

UnifiedCache *UnifiedCache::getInstance(UErrorCode &status) {
    umtx_initOnce(gCacheInitOnce, &cacheInit, status);
    if (U_FAILURE(status)) {
        return NULL;
    }
    U_ASSERT(gCache != NULL);
    return gCache;
}